

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary_tests.cc
# Opt level: O3

void __thiscall
lf::mesh::utils::test::meshFunctionUnary_adjoint_Test::~meshFunctionUnary_adjoint_Test
          (meshFunctionUnary_adjoint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(meshFunctionUnary, adjoint) {
  auto reader = io::test_utils::getGmshReader("two_element_hybrid_2d.msh", 2);
  auto mesh = reader.mesh();
  using c_t = std::complex<double>;
  MeshFunctionConstant a(c_t{1, 1});
  MeshFunctionConstant b(c_t{1, -1});
  auto mfVectorTrans = MeshFunctionGlobal(
      [](auto x) -> Eigen::Matrix<double, 1, 2> { return x.transpose(); });
  checkMeshFunctionEqual(*mesh, adjoint(a * mfVector), b * mfVectorTrans);
  checkMeshFunctionEqual(*mesh, adjoint(a * mfVector_dynamic),
                         b * mfVectorTrans);

  auto mfRowVectorT = MeshFunctionGlobal(
      [](auto x) -> Eigen::Vector2d { return Eigen::Vector2d(x[1], -x[0]); });
  checkMeshFunctionEqual(*mesh, adjoint(a * mfRowVector), b * mfRowVectorT);
  checkMeshFunctionEqual(*mesh, adjoint(a * mfRowVector_dynamic),
                         b * mfRowVectorT);

  checkMeshFunctionEqual(*mesh, adjoint(a * mfMatrix), b * mfMatrix);
}